

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  string errorMessage;
  Board *local_708;
  Board *local_700;
  Board board;
  ifstream inputFile;
  Board local_318;
  ofstream outputFile;
  
  if (argc == 4) {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"bfs");
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = strcmp(__s1,"dfs");
      if (iVar2 == 0) {
        iVar2 = 1;
      }
      else {
        iVar2 = strcmp(__s1,"dijkstra");
        if (iVar2 != 0) {
          std::__cxx11::string::string((string *)&local_7e0,"",(allocator *)&inputFile);
          errorOutput(&local_7e0);
          std::__cxx11::string::~string((string *)&local_7e0);
          return -1;
        }
        iVar2 = 2;
      }
    }
    std::ifstream::ifstream(&inputFile,argv[2],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__cxx11::string::string
                ((string *)&local_800,
                 "There was a problem with the input file, please verify that the input file is there."
                 ,(allocator *)&outputFile);
      errorOutput(&local_800);
      std::__cxx11::string::~string((string *)&local_800);
      iVar2 = -1;
    }
    else {
      std::ofstream::ofstream(&outputFile,argv[3],_S_out);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        std::ifstream::close();
        std::__cxx11::string::string
                  ((string *)&local_820,
                   "There was a problem with the output file, please verify that the output file is there."
                   ,(allocator *)&errorMessage);
        errorOutput(&local_820);
        std::__cxx11::string::~string((string *)&local_820);
        iVar2 = -1;
      }
      else {
        Board::Board(&board);
        Board::populateBoard(&board,&inputFile);
        printSeperator();
        std::__cxx11::string::string
                  ((string *)&local_840,"Initial board state:\n",(allocator *)&errorMessage);
        Board::print(&board,&local_840);
        std::__cxx11::string::~string((string *)&local_840);
        lVar3 = std::chrono::_V2::system_clock::now();
        Board::Board(&local_318,&board);
        Solver::Solver((Solver *)&errorMessage,&local_318);
        Board::~Board(&local_318);
        Solver::solve((Solver *)&errorMessage,iVar2);
        lVar4 = std::chrono::_V2::system_clock::now();
        printSeperator();
        poVar5 = std::operator<<((ostream *)&std::cout,"Puzzle is solved.");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Number of steps to solve: ");
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        printSeperator();
        iVar2 = 0;
        while (local_700 != local_708) {
          std::__cxx11::to_string(&local_7a0,iVar2);
          std::operator+(&local_780,"Step ",&local_7a0);
          std::operator+(&local_760,&local_780,"\n");
          local_700 = local_700 + -1;
          Board::print(local_700,&local_760);
          std::__cxx11::string::~string((string *)&local_760);
          std::__cxx11::string::~string((string *)&local_780);
          std::__cxx11::string::~string((string *)&local_7a0);
          Board::exportToFile(local_700,&outputFile);
          poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&outputFile);
          std::endl<char,std::char_traits<char>>(poVar5);
          iVar2 = iVar2 + 1;
        }
        printSeperator();
        poVar5 = std::operator<<((ostream *)&std::cout,"The puzzle is solved.");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "The total time in seconds the algorithm took to solve the puzzle: "
                                );
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "The total number of boards seen to find the solution including the initial state: "
                                );
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "The block with letter \'A\' represents the block which is asked to be rescued."
                                );
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "The output states are written to the output file you provided.");
        std::endl<char,std::char_traits<char>>(poVar5);
        printSeperator();
        std::ifstream::close();
        std::ofstream::close();
        Solver::~Solver((Solver *)&errorMessage);
        Board::~Board(&board);
        iVar2 = 0;
      }
      std::ofstream::~ofstream(&outputFile);
    }
    std::ifstream::~ifstream(&inputFile);
  }
  else {
    std::__cxx11::string::string((string *)&local_7c0,"",(allocator *)&inputFile);
    errorOutput(&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[]) {

    // Do not execute if the number of parameters are wrong.
    if (argc != 4) {
        errorOutput();
        return 0;
    }

    // Open the files.
    int algorithm = 0;
    if (strcmp(argv[1], "bfs") == 0) {
        algorithm = BFS;
    } else if (strcmp(argv[1], "dfs") == 0) {
        algorithm = DFS;
    } else if (strcmp(argv[1], "dijkstra") == 0) {
        algorithm = DIJKSTRA;
    } else {
        errorOutput();
        return -1;
    }

    ifstream inputFile(argv[2]);
    if (!inputFile.is_open()) {
        errorOutput("There was a problem with the input file, please verify that the input file is there.");
        return -1;
    }

    ofstream outputFile(argv[3]);
    if (!outputFile.is_open()) {
        inputFile.close();
        errorOutput("There was a problem with the output file, please verify that the output file is there.");
        return -1;
    }

    try {
        // Create and populate the board from the input file.
        Board board;
        board.populateBoard(inputFile);

        // Print the initial state of the board.
        printSeperator();
        board.print("Initial board state:\n");


        // Record start time
        auto start = chrono::high_resolution_clock::now();

        // Solve the board with the algorithm provided.
        Solver solution(board);
        solution.solve(algorithm);

        // Record end time
        auto finish = chrono::high_resolution_clock::now();

        printSeperator();
        pp("Puzzle is solved.");
        pp2("Number of steps to solve: ", solution.steps.size());
        printSeperator();

        int i = 0;
        for (vector<Board>::reverse_iterator it = solution.steps.rbegin(); it != solution.steps.rend(); ++it) {

            // Print the board to the screen.
            it->print("Step " + to_string(i) + "\n");

            // Export the board state to the output file.
            it->exportToFile(outputFile);

            // Set the spacing between different board states in the file.
            outputFile << endl << endl;
            i++;
        }

        printSeperator();
        std::chrono::duration<double> runningTime = finish - start;
        pp("The puzzle is solved.");
        pp2("The total time in seconds the algorithm took to solve the puzzle: ", runningTime.count());
        pp2("The total number of boards seen to find the solution including the initial state: ",
            solution.numberOfNodes);
        pp("The block with letter 'A' represents the block which is asked to be rescued.");
        pp("The output states are written to the output file you provided.");
        printSeperator();

        inputFile.close();
        outputFile.close();
        return 0;
    } catch (string errorMessage) {
        cerr << errorMessage << endl;
        return -1;
    }
}